

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3auxFilterMethod(sqlite3_vtab_cursor *pCursor,int idxNum,char *idxStr,int nVal,
                       sqlite3_value **apVal)

{
  Fts3Table *p;
  uchar *puVar1;
  sqlite3_vtab *psVar2;
  size_t sVar3;
  bool bVar4;
  uchar *zStr;
  int iNext;
  int iLangid;
  int iLe;
  int iGe;
  int iEq;
  int iLangVal;
  int isScan;
  int rc;
  Fts3Table *pFts3;
  Fts3auxCursor *pCsr;
  sqlite3_value **apVal_local;
  int nVal_local;
  char *idxStr_local;
  int idxNum_local;
  sqlite3_vtab_cursor *pCursor_local;
  
  p = (Fts3Table *)pCursor->pVtab[1].pModule;
  iEq = 0;
  iGe = 0;
  iLe = -1;
  iLangid = -1;
  iNext = -1;
  zStr._4_4_ = 0xffffffff;
  if (idxNum == 1) {
    iLe = 0;
    zStr._0_4_ = 1;
  }
  else {
    iEq = 1;
    bVar4 = (idxNum & 2U) != 0;
    if (bVar4) {
      iLangid = 0;
    }
    zStr._0_4_ = (uint)bVar4;
    if ((idxNum & 4U) != 0) {
      iNext = (uint)zStr;
      zStr._0_4_ = (uint)zStr + 1;
    }
  }
  if ((int)(uint)zStr < nVal) {
    zStr._4_4_ = (uint)zStr;
  }
  sqlite3Fts3SegReaderFinish((Fts3MultiSegReader *)(pCursor + 1));
  sqlite3_free(pCursor[0xc].pVtab);
  sqlite3_free(pCursor[0x14].pVtab);
  memset(pCursor + 1,0,0xa0);
  *(undefined4 *)&pCursor[0xe].pVtab = 3;
  if (iEq != 0) {
    *(uint *)&pCursor[0xe].pVtab = *(uint *)&pCursor[0xe].pVtab | 0x10;
  }
  if (((-1 < iLe) || (-1 < iLangid)) &&
     (puVar1 = sqlite3_value_text(*apVal), puVar1 != (uchar *)0x0)) {
    psVar2 = (sqlite3_vtab *)sqlite3_mprintf("%s",puVar1);
    pCursor[0xc].pVtab = psVar2;
    if (pCursor[0xc].pVtab == (sqlite3_vtab *)0x0) {
      return 7;
    }
    sVar3 = strlen((char *)pCursor[0xc].pVtab);
    *(int *)&pCursor[0xd].pVtab = (int)sVar3;
  }
  if (-1 < iNext) {
    puVar1 = sqlite3_value_text(apVal[iNext]);
    psVar2 = (sqlite3_vtab *)sqlite3_mprintf("%s",puVar1);
    pCursor[0xf].pVtab = psVar2;
    if (pCursor[0xf].pVtab == (sqlite3_vtab *)0x0) {
      return 7;
    }
    sVar3 = strlen((char *)pCursor[0xf].pVtab);
    *(int *)&pCursor[0x10].pVtab = (int)sVar3;
  }
  if ((-1 < (int)zStr._4_4_) && (iGe = sqlite3_value_int(apVal[(int)zStr._4_4_]), iGe < 0)) {
    iGe = 0;
  }
  *(int *)((long)&pCursor[0x10].pVtab + 4) = iGe;
  iLangVal = sqlite3Fts3SegReaderCursor
                       (p,iGe,0,-2,(char *)pCursor[0xc].pVtab,*(int *)&pCursor[0xd].pVtab,0,iEq,
                        (Fts3MultiSegReader *)(pCursor + 1));
  if (iLangVal == 0) {
    iLangVal = sqlite3Fts3SegReaderStart
                         (p,(Fts3MultiSegReader *)(pCursor + 1),(Fts3SegFilter *)(pCursor + 0xc));
  }
  if (iLangVal == 0) {
    iLangVal = fts3auxNextMethod(pCursor);
  }
  return iLangVal;
}

Assistant:

static int fts3auxFilterMethod(
  sqlite3_vtab_cursor *pCursor,   /* The cursor used for this query */
  int idxNum,                     /* Strategy index */
  const char *idxStr,             /* Unused */
  int nVal,                       /* Number of elements in apVal */
  sqlite3_value **apVal           /* Arguments for the indexing scheme */
){
  Fts3auxCursor *pCsr = (Fts3auxCursor *)pCursor;
  Fts3Table *pFts3 = ((Fts3auxTable *)pCursor->pVtab)->pFts3Tab;
  int rc;
  int isScan = 0;
  int iLangVal = 0;               /* Language id to query */

  int iEq = -1;                   /* Index of term=? value in apVal */
  int iGe = -1;                   /* Index of term>=? value in apVal */
  int iLe = -1;                   /* Index of term<=? value in apVal */
  int iLangid = -1;               /* Index of languageid=? value in apVal */
  int iNext = 0;

  UNUSED_PARAMETER(nVal);
  UNUSED_PARAMETER(idxStr);

  assert( idxStr==0 );
  assert( idxNum==FTS4AUX_EQ_CONSTRAINT || idxNum==0
       || idxNum==FTS4AUX_LE_CONSTRAINT || idxNum==FTS4AUX_GE_CONSTRAINT
       || idxNum==(FTS4AUX_LE_CONSTRAINT|FTS4AUX_GE_CONSTRAINT)
  );

  if( idxNum==FTS4AUX_EQ_CONSTRAINT ){
    iEq = iNext++;
  }else{
    isScan = 1;
    if( idxNum & FTS4AUX_GE_CONSTRAINT ){
      iGe = iNext++;
    }
    if( idxNum & FTS4AUX_LE_CONSTRAINT ){
      iLe = iNext++;
    }
  }
  if( iNext<nVal ){
    iLangid = iNext++;
  }

  /* In case this cursor is being reused, close and zero it. */
  testcase(pCsr->filter.zTerm);
  sqlite3Fts3SegReaderFinish(&pCsr->csr);
  sqlite3_free((void *)pCsr->filter.zTerm);
  sqlite3_free(pCsr->aStat);
  memset(&pCsr->csr, 0, ((u8*)&pCsr[1]) - (u8*)&pCsr->csr);

  pCsr->filter.flags = FTS3_SEGMENT_REQUIRE_POS|FTS3_SEGMENT_IGNORE_EMPTY;
  if( isScan ) pCsr->filter.flags |= FTS3_SEGMENT_SCAN;

  if( iEq>=0 || iGe>=0 ){
    const unsigned char *zStr = sqlite3_value_text(apVal[0]);
    assert( (iEq==0 && iGe==-1) || (iEq==-1 && iGe==0) );
    if( zStr ){
      pCsr->filter.zTerm = sqlite3_mprintf("%s", zStr);
      if( pCsr->filter.zTerm==0 ) return SQLITE_NOMEM;
      pCsr->filter.nTerm = (int)strlen(pCsr->filter.zTerm);
    }
  }

  if( iLe>=0 ){
    pCsr->zStop = sqlite3_mprintf("%s", sqlite3_value_text(apVal[iLe]));
    if( pCsr->zStop==0 ) return SQLITE_NOMEM;
    pCsr->nStop = (int)strlen(pCsr->zStop);
  }
  
  if( iLangid>=0 ){
    iLangVal = sqlite3_value_int(apVal[iLangid]);

    /* If the user specified a negative value for the languageid, use zero
    ** instead. This works, as the "languageid=?" constraint will also
    ** be tested by the VDBE layer. The test will always be false (since
    ** this module will not return a row with a negative languageid), and
    ** so the overall query will return zero rows.  */
    if( iLangVal<0 ) iLangVal = 0;
  }
  pCsr->iLangid = iLangVal;

  rc = sqlite3Fts3SegReaderCursor(pFts3, iLangVal, 0, FTS3_SEGCURSOR_ALL,
      pCsr->filter.zTerm, pCsr->filter.nTerm, 0, isScan, &pCsr->csr
  );
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts3SegReaderStart(pFts3, &pCsr->csr, &pCsr->filter);
  }

  if( rc==SQLITE_OK ) rc = fts3auxNextMethod(pCursor);
  return rc;
}